

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_2,_5,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  long lVar2;
  int col;
  long lVar3;
  bool bVar4;
  undefined4 uVar5;
  Vector<float,_3> res;
  Mat2 m_1;
  Mat2 m;
  float afStack_a0 [6];
  float local_88 [6];
  int local_70 [6];
  Matrix<float,_2,_2> local_58;
  Matrix<float,_2,_2> local_48;
  float local_30;
  float local_2c;
  undefined4 local_28;
  float local_24;
  undefined4 local_20;
  float local_1c;
  undefined4 local_18;
  float local_14;
  
  pfVar1 = (float *)&local_48;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar3) {
        uVar5 = 0;
      }
      pfVar1[lVar3 * 2] = (float)uVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    pfVar1 = pfVar1 + 1;
    bVar4 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar4);
  local_48.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
  local_48.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  afStack_a0[0] = 2.2104858e-38;
  afStack_a0[1] = 0.0;
  decrement<float,2,2>((MatrixCaseUtils *)&local_20,&local_48);
  local_88[5] = local_1c + local_14;
  local_88[3] = (float)local_20;
  local_88[4] = (float)local_18;
  pfVar1 = (float *)&local_58;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar3) {
        uVar5 = 0;
      }
      pfVar1[lVar3 * 2] = (float)uVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    pfVar1 = pfVar1 + 1;
    bVar4 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar4);
  local_58.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
  local_58.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  afStack_a0[0] = 2.2105052e-38;
  afStack_a0[1] = 0.0;
  decrement<float,2,2>((MatrixCaseUtils *)&local_30,&local_58);
  local_88[0] = local_30;
  local_88[1] = (float)local_28;
  local_88[2] = local_2c + local_24;
  afStack_a0[2] = 0.0;
  afStack_a0[3] = 0.0;
  afStack_a0[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_a0[lVar2 + 2] = local_88[lVar2 + 3] + local_88[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_70[2] = 0;
  local_70[3] = 1;
  local_70[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_70[lVar2]] = afStack_a0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}